

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

int __thiscall CMU462::Application::init(Application *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Application *in_stack_00000010;
  CameraInfo cameraInfo;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff30;
  GLsizei GVar2;
  undefined1 *screenH;
  Scene *in_stack_ffffffffffffff40;
  Camera *in_stack_ffffffffffffff50;
  undefined1 local_a0 [120];
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  Color local_18;
  Application *local_8;
  
  local_8 = this;
  if (this->scene != (Scene *)0x0) {
    in_stack_ffffffffffffff40 = this->scene;
    if (in_stack_ffffffffffffff40 != (Scene *)0x0) {
      DynamicScene::Scene::~Scene
                ((Scene *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      operator_delete(in_stack_ffffffffffffff40);
    }
    this->scene = (Scene *)0x0;
  }
  OSDText::init(&this->textManager,(EVP_PKEY_CTX *)(ulong)((this->super_Renderer).use_hdpi & 1));
  Color::Color(&local_18,1.0,1.0,1.0,1.0);
  (this->text_color).r = local_18.r;
  (this->text_color).g = local_18.g;
  (this->text_color).b = local_18.b;
  (this->text_color).a = local_18.a;
  this->leftDown = false;
  this->rightDown = false;
  this->middleDown = false;
  this->show_coordinates = true;
  this->show_hud = true;
  glEnable(0xb50);
  glEnable(0xb20);
  glEnable(0xb10);
  uVar1 = 0x1102;
  glHint(0xc52);
  glHint(0xc51,uVar1);
  GVar2 = 1;
  (*__glewGenFramebuffers)(1,&this->backface_fbo);
  (*__glewGenFramebuffers)(GVar2,&this->frntface_fbo);
  glGenTextures(GVar2,&this->backface_color_tex);
  glGenTextures(GVar2,&this->backface_depth_tex);
  glGenTextures(GVar2,&this->frntface_color_tex);
  glGenTextures(GVar2,&this->frntface_depth_tex);
  initialize_style(in_stack_00000010);
  *(undefined4 *)&(this->super_Renderer).field_0xc = 0;
  this->action = Navigate;
  this->scene = (Scene *)0x0;
  this->screenH = 600;
  this->screenW = 600;
  screenH = local_a0;
  Collada::CameraInfo::CameraInfo((CameraInfo *)CONCAT44(GVar2,in_stack_ffffffffffffff30));
  local_28 = 0x41a00000;
  local_24 = 0x41e00000;
  local_20 = 0x3dcccccd;
  local_1c = 0x42c80000;
  Camera::configure(in_stack_ffffffffffffff50,(CameraInfo *)this,(size_t)in_stack_ffffffffffffff40,
                    (size_t)screenH);
  Camera::configure(in_stack_ffffffffffffff50,(CameraInfo *)this,(size_t)in_stack_ffffffffffffff40,
                    (size_t)screenH);
  Timeline::setMaxFrame(&this->timeline,300);
  Timeline::action_rewind(&this->timeline);
  Timeline::resize((Timeline *)CONCAT44(uVar1,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c,
                   in_stack_ffffffffffffff18);
  Timeline::move(&this->timeline,0,(int)this->screenH + -0x40);
  Timeline::markTime((Timeline *)in_stack_ffffffffffffff50,(int)((ulong)this >> 0x20));
  Collada::CameraInfo::~CameraInfo((CameraInfo *)0x26438c);
  return extraout_EAX;
}

Assistant:

void Application::init() {
  if (scene != nullptr) {
    delete scene;
    scene = nullptr;
  }

  textManager.init(use_hdpi);
  text_color = Color(1.0, 1.0, 1.0);

  // Setup all the basic internal state to default values,
  // as well as some basic OpenGL state (like depth testing
  // and lighting).

  // Set the integer bit vector representing which keys are down.
  leftDown = false;
  rightDown = false;
  middleDown = false;

  show_coordinates = true;
  show_hud = true;

  // Lighting needs to be explicitly enabled.
  glEnable(GL_LIGHTING);

  // Enable anti-aliasing and circular points.
  glEnable(GL_LINE_SMOOTH);
  // glEnable( GL_POLYGON_SMOOTH ); // XXX causes cracks!
  glEnable(GL_POINT_SMOOTH);
  glHint(GL_LINE_SMOOTH_HINT, GL_NICEST);
  // glHint( GL_POLYGON_SMOOTH_HINT, GL_NICEST );
  glHint(GL_POINT_SMOOTH_HINT, GL_NICEST);

  // initialize fbos
  glGenFramebuffers(1, &backface_fbo);
  glGenFramebuffers(1, &frntface_fbo);
  glGenTextures(1, &backface_color_tex);
  glGenTextures(1, &backface_depth_tex);
  glGenTextures(1, &frntface_color_tex);
  glGenTextures(1, &frntface_depth_tex);

  // Initialize styles (colors, line widths, etc.) that will be used
  // to draw different types of mesh elements in various situations.
  initialize_style();

  mode = MODEL_MODE;
  action = Action::Navigate;
  scene = nullptr;

  // Make a dummy camera so resize() doesn't crash before the scene has been
  // loaded.
  // NOTE: there's a chicken-and-egg problem here, because load()
  // requires init, and init requires init_camera (which is only called by
  // load()).
  screenW = screenH = 600;  // Default value
  CameraInfo cameraInfo;
  cameraInfo.hFov = 20;
  cameraInfo.vFov = 28;
  cameraInfo.nClip = 0.1;
  cameraInfo.fClip = 100;
  camera.configure(cameraInfo, screenW, screenH);
  canonicalCamera.configure(cameraInfo, screenW, screenH);

  // Now initialize the timeline
  timeline.setMaxFrame(300);
  timeline.action_rewind();
  timeline.resize(screenW, 64);
  timeline.move(0, screenH - 64);
  timeline.markTime(0);
}